

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

SC_WireLoad * Abc_SclFetchWireLoadModel(SC_Lib *p,char *pWLoadUsed)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  int level;
  long lVar4;
  SC_WireLoad *pSVar5;
  
  if (pWLoadUsed == (char *)0x0) {
    __assert_fail("pWLoadUsed != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                  ,0x170,"SC_WireLoad *Abc_SclFetchWireLoadModel(SC_Lib *, char *)");
  }
  iVar1 = (p->vWireLoads).nSize;
  if ((long)iVar1 < 1) {
    lVar4 = 0;
    pSVar5 = (SC_WireLoad *)0x0;
LAB_00470aa7:
    level = (int)p;
    if ((int)lVar4 != iVar1) {
      return pSVar5;
    }
  }
  else {
    ppvVar2 = (p->vWireLoads).pArray;
    lVar4 = 0;
    do {
      pSVar5 = (SC_WireLoad *)ppvVar2[lVar4];
      p = (SC_Lib *)pSVar5->pName;
      iVar3 = strcmp((char *)p,pWLoadUsed);
      level = (int)p;
      if (iVar3 == 0) goto LAB_00470aa7;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  Abc_Print(level,"Cannot find wire load model \"%s\".\n",pWLoadUsed);
  exit(1);
}

Assistant:

SC_WireLoad * Abc_SclFetchWireLoadModel( SC_Lib * p, char * pWLoadUsed )
{
    SC_WireLoad * pWL = NULL;
    int i;
    // Get the actual table and reformat it for 'wire_cap' output:
    assert( pWLoadUsed != NULL );
    SC_LibForEachWireLoad( p, pWL, i )
        if ( !strcmp(pWL->pName, pWLoadUsed) )
            break;
    if ( i == Vec_PtrSize(&p->vWireLoads) )
    {
        Abc_Print( -1, "Cannot find wire load model \"%s\".\n", pWLoadUsed );
        exit(1);
    }
//    printf( "Using wireload model \"%s\".\n", pWL->pName );
    return pWL;
}